

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.h
# Opt level: O2

bool __thiscall
FastPForLib::CSVFlatFile::nextRow<std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (CSVFlatFile *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *container)

{
  pointer pbVar1;
  bool bVar2;
  mapped_type *pmVar3;
  long lVar4;
  size_t k;
  ulong uVar5;
  long lVar6;
  
  bVar2 = CSVReader::hasNext(&this->mainreader);
  if (bVar2) {
    lVar6 = 0;
    lVar4 = 0;
    for (uVar5 = 0;
        pbVar1 = (this->mainreader).currentData.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar5 < (ulong)((long)(this->mainreader).currentData.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
        uVar5 = uVar5 + 1) {
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                             *)((long)&(((this->mapping).
                                         super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_t)._M_impl.
                                       field_0x0 + lVar6),
                            (key_type *)((long)&(pbVar1->_M_dataplus)._M_p + lVar4));
      lVar4 = lVar4 + 0x20;
      lVar6 = lVar6 + 0x30;
      (container->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar5] = (uint)*pmVar3;
    }
  }
  return bVar2;
}

Assistant:

bool nextRow(C &container) {
    if (mainreader.hasNext()) {
      const std::vector<std::string> &row = mainreader.nextRow();
      for (size_t k = 0; k < row.size(); ++k) {
        container[k] = static_cast<uint32_t>(mapping[k][row[k]]);
      }
      return true;
    } else
      return false;
  }